

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_priority_search.hpp
# Opt level: O2

void __thiscall
pico_tree::internal::
priority_search_nearest_euclidean<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_128UL>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::internal::point<float,_128UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_float>_>,_int>
::search_nearest(priority_search_nearest_euclidean<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_128UL>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::internal::point<float,_128UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_float>_>,_int>
                 *this,node_type *node,scalar_type node_box_distance)

{
  float fVar1;
  int iVar2;
  int iVar3;
  kd_tree_node_topological<int,_float> *pkVar4;
  pointer piVar5;
  search_nn<pico_tree::neighbor<int,_float>_> *psVar6;
  point_type *ppVar7;
  neighbor_type *pnVar8;
  bool bVar9;
  kd_tree_node_topological<int,_float> *node_00;
  int *piVar10;
  scalar_type sVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float local_34;
  kd_tree_node_topological<int,_float> *local_30;
  
  pkVar4 = (node->
           super_kd_tree_node_base<pico_tree::internal::kd_tree_node_topological<int,_float>_>).left
  ;
  node_00 = (node->
            super_kd_tree_node_base<pico_tree::internal::kd_tree_node_topological<int,_float>_>).
            right;
  if (pkVar4 == (kd_tree_node_topological<int,_float> *)0x0 &&
      node_00 == (kd_tree_node_topological<int,_float> *)0x0) {
    piVar5 = (this->indices_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = (node->data).leaf.end_idx;
    for (piVar10 = piVar5 + (node->data).branch.split_dim; piVar10 < piVar5 + iVar2;
        piVar10 = piVar10 + 1) {
      psVar6 = this->visitor_;
      iVar3 = *piVar10;
      ppVar7 = (this->query_).point_;
      sVar11 = sum<float_const*,float_const*,float_const*,pico_tree::internal::squared_r1_distance_fn>
                         (ppVar7,ppVar7 + 1,
                          ((((this->space_).space_)->
                           super__Vector_base<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish)->_M_elems +
                          (long)iVar3 * 0x80);
      pnVar8 = psVar6->nn_;
      if (sVar11 < pnVar8->distance) {
        pnVar8->index = iVar3;
        pnVar8->distance = sVar11;
      }
    }
  }
  else {
    fVar1 = (((this->query_).point_)->elems_)._M_elems[(node->data).branch.split_dim];
    fVar14 = (node->data).branch.left_max;
    fVar13 = (node->data).branch.right_min;
    if ((fVar14 + fVar13) - fVar1 <= fVar1) {
      fVar12 = (node->data).branch.right_max;
      bVar9 = fVar1 < fVar12;
      local_30 = pkVar4;
    }
    else {
      fVar12 = (node->data).branch.left_min;
      bVar9 = fVar12 < fVar1;
      local_30 = node_00;
      node_00 = pkVar4;
      fVar14 = fVar13;
    }
    fVar13 = 0.0;
    if (!bVar9) {
      fVar13 = (fVar12 - fVar1) * (fVar12 - fVar1);
    }
    search_nearest(this,node_00,node_box_distance);
    local_34 = (node_box_distance - fVar13) + (fVar14 - fVar1) * (fVar14 - fVar1);
    if (local_34 < this->visitor_->nn_->distance) {
      ::std::
      priority_queue<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>,std::vector<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>,std::allocator<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>>>,std::greater<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>>>
      ::emplace<float&,pico_tree::internal::kd_tree_node_topological<int,float>const*&>
                ((priority_queue<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>,std::vector<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>,std::allocator<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>>>,std::greater<std::pair<float,pico_tree::internal::kd_tree_node_topological<int,float>const*>>>
                  *)&this->queue_,&local_34,&local_30);
    }
  }
  return;
}

Assistant:

inline void search_nearest(
      node_type const* const node, scalar_type node_box_distance) {
    if (node->is_leaf()) {
      auto begin = indices_.begin() + node->data.leaf.begin_idx;
      auto const end = indices_.begin() + node->data.leaf.end_idx;
      for (; begin < end; ++begin) {
        visitor_(*begin, metric_(query_.begin(), query_.end(), space_[*begin]));
      }
    } else {
      // Go left or right and then check if we should still go down the other
      // side based on the current minimum distance.
      scalar_type const v =
          query_[static_cast<size_t>(node->data.branch.split_dim)];
      scalar_type old_offset;
      scalar_type new_offset;
      node_type const* node_1st;
      node_type const* node_2nd;

      // On equals we would possibly need to go left as well. However, this is
      // handled by the if statement below this one: the check that max search
      // radius still hits the split value after having traversed the first
      // branch.
      // If left_max - v > 0, this means that the query is inside the left node,
      // if right_min - v < 0 it's inside the right one. For the area in between
      // we just pick the closest one by summing them.
      if ((node->data.branch.left_max + node->data.branch.right_min - v - v) >
          0) {
        node_1st = node->left;
        node_2nd = node->right;
        if (v > node->data.branch.left_min) {
          old_offset = scalar_type(0);
        } else {
          old_offset = metric_(node->data.branch.left_min - v);
        }
        new_offset = metric_(node->data.branch.right_min - v);
      } else {
        node_1st = node->right;
        node_2nd = node->left;
        if (v < node->data.branch.right_max) {
          old_offset = scalar_type(0);
        } else {
          old_offset = metric_(node->data.branch.right_max - v);
        }
        new_offset = metric_(node->data.branch.left_max - v);
      }

      // The distance and offset for node_1st is the same as that of its parent.
      search_nearest(node_1st, node_box_distance);

      // Calculate the distance to node_2nd.
      // NOTE: This method only works with Lp norms to which the exponent is not
      // applied.
      node_box_distance = node_box_distance - old_offset + new_offset;

      // Add to priority queue to be searched later.
      if (visitor_.max() > node_box_distance) {
        queue_.emplace(node_box_distance, node_2nd);
      }
    }
  }